

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true,_false,_true>_>_>
::multiply_target_and_add_to
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true,_false,_true>_>_>
           *this,Index sourceColumnIndex,Field_element *coefficient,Index targetColumnIndex)

{
  anon_class_32_4_5df6e713 local_50;
  Column *local_30;
  Column *col;
  Field_element *pFStack_20;
  Index targetColumnIndex_local;
  Field_element *coefficient_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true,_false,_true>_>_>
  *pCStack_10;
  Index sourceColumnIndex_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true,_false,_true>_>_>
  *this_local;
  
  col._4_4_ = targetColumnIndex;
  pFStack_20 = coefficient;
  coefficient_local._4_4_ = sourceColumnIndex;
  pCStack_10 = this;
  local_50.col = get_column(this,targetColumnIndex);
  local_50.coefficient = pFStack_20;
  local_50.sourceColumnIndex = (Index *)((long)&coefficient_local + 4);
  local_50.this = this;
  local_30 = local_50.col;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true,false,true>>>
  ::
  _add_to<Gudhi::persistence_matrix::Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true,false,true>>>::multiply_target_and_add_to(unsigned_int,bool_const&,unsigned_int)::_lambda()_1_>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true,false,true>>>
              *)this,local_50.col,&local_50);
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::multiply_target_and_add_to(Index sourceColumnIndex,
                                                                    const Field_element& coefficient,
                                                                    Index targetColumnIndex)
{
  auto& col = get_column(targetColumnIndex);
  _add_to(col, [&]() { col.multiply_target_and_add(coefficient, get_column(sourceColumnIndex)); });
}